

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp
          (ScalarEvolutionAnalysis *this,Instruction *multiply)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *pIVar3;
  SENode *pSVar4;
  SENode *operand_2;
  SENode *op2;
  SENode *op1;
  DefUseManager *def_use;
  Instruction *multiply_local;
  ScalarEvolutionAnalysis *this_local;
  
  OVar1 = Instruction::opcode(multiply);
  if (OVar1 != OpIMul) {
    __assert_fail("multiply->opcode() == spv::Op::OpIMul && \"Multiply node did not come from a multiply instruction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,100,
                  "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp(const Instruction *)"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar2 = Instruction::GetSingleWordInOperand(multiply,0);
  pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar2);
  pSVar4 = AnalyzeInstruction(this,pIVar3);
  uVar2 = Instruction::GetSingleWordInOperand(multiply,1);
  pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar2);
  operand_2 = AnalyzeInstruction(this,pIVar3);
  pSVar4 = CreateMultiplyNode(this,pSVar4,operand_2);
  return pSVar4;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeMultiplyOp(
    const Instruction* multiply) {
  assert(multiply->opcode() == spv::Op::OpIMul &&
         "Multiply node did not come from a multiply instruction");
  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  SENode* op1 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(0)));
  SENode* op2 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(1)));

  return CreateMultiplyNode(op1, op2);
}